

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateManager.cpp
# Opt level: O2

Endpoint * __thiscall
helics::MessageFederateManager::getDataSink(MessageFederateManager *this,string_view name)

{
  bool bVar1;
  string *__lhs;
  BlockIterator<const_helics::Endpoint,_32,_const_helics::Endpoint_*const_*> ept;
  shared_handle sharedEpt;
  BlockIterator<const_helics::Endpoint,_32,_const_helics::Endpoint_*const_*> local_60;
  shared_handle local_48;
  const_iterator local_30;
  
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
  ::lock(&local_48,&this->mLocalEndpoints);
  gmlc::containers::
  DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>::find
            (&local_60,local_48.data,name);
  gmlc::containers::StableBlockVector<helics::Endpoint,_5U,_std::allocator<helics::Endpoint>_>::end
            (&local_30,&(local_48.data)->dataStorage);
  if ((local_60.vec == local_30.vec) && (local_60.offset == local_30.offset)) {
    local_60.ptr = (Endpoint *)invalidEpt;
  }
  else {
    __lhs = Interface::getExtractionType_abi_cxx11_(&(local_60.ptr)->super_Interface);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            __lhs,"sink");
    if (!bVar1) {
      local_60.ptr = (Endpoint *)invalidEptNC;
    }
  }
  std::shared_lock<std::shared_mutex>::~shared_lock(&local_48.m_handle_lock);
  return local_60.ptr;
}

Assistant:

const Endpoint& MessageFederateManager::getDataSink(std::string_view name) const
{
    auto sharedEpt = mLocalEndpoints.lock();
    auto ept = sharedEpt->find(name);
    if (ept == sharedEpt.end()) {
        return invalidEpt;
    }
    if (ept->getType() != "sink") {
        return invalidEptNC;
    }
    return *ept;
}